

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

TValue * lj_meta_comp(lua_State *L,cTValue *o1,cTValue *o2,int op)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  cTValue *pcVar4;
  cTValue *o2_00;
  TValue *pTVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  MMS mm;
  code *pcVar9;
  
  uVar8 = o1->u64;
  lVar3 = (long)uVar8 >> 0x2f;
  if (lVar3 != -0xb) {
    lVar7 = o2->it64 >> 0x2f;
    if (lVar7 != -0xb) {
      pcVar4 = o2;
      if (lVar3 == lVar7) {
        if (lVar3 == -5) {
          uVar1 = lj_str_cmp((GCstr *)(uVar8 & 0x7fffffffffff),(GCstr *)(o2->it64 & 0x7fffffffffff))
          ;
          uVar6 = (uint)((int)uVar1 < 1);
          if ((op & 2U) == 0) {
            uVar6 = uVar1 >> 0x1f;
          }
          return (TValue *)(ulong)(op & 1U ^ uVar6);
        }
      }
      else if ((1 < lVar3 + 3U) || (1 < lVar7 + 3U)) goto LAB_001136e4;
      while( true ) {
        o2 = pcVar4;
        mm = MM_le - ((op & 2U) == 0);
        pcVar4 = lj_meta_lookup(L,o1,mm);
        o2_00 = lj_meta_lookup(L,o2,mm);
        if ((pcVar4->u64 != 0xffffffffffffffff) && (iVar2 = lj_obj_equal(pcVar4,o2_00), iVar2 != 0))
        {
          uVar8 = L->base[-2].u64 & 0x7fffffffffff;
          if (*(char *)(uVar8 + 10) == '\0') {
            pTVar5 = L->base + *(byte *)(*(long *)(uVar8 + 0x20) + -0x5d);
          }
          else {
            pTVar5 = L->top;
          }
          pcVar9 = lj_cont_condf;
          if ((op & 1U) == 0) {
            pcVar9 = lj_cont_condt;
          }
          pTVar5->n = (lua_Number)pcVar9;
          pTVar5[1].u64 = 0xffffffffffffffff;
          pTVar5[2] = *pcVar4;
          pTVar5[3].u64 = 0xffffffffffffffff;
          pTVar5[4] = *o1;
          pTVar5[5] = *o2;
          return pTVar5 + 4;
        }
        if ((op & 2U) == 0) break;
        op = op ^ 3;
        pcVar4 = o1;
        o1 = o2;
      }
      goto LAB_001136e4;
    }
  }
  pcVar4 = o2;
  if ((uint)(uVar8 >> 0x2f) == 0x1fff5) {
    pcVar4 = o1;
  }
  pcVar4 = lj_meta_lookup(L,pcVar4,MM_le - ((op & 2U) == 0));
  if (pcVar4->u64 != 0xffffffffffffffff) {
    uVar8 = L->base[-2].u64 & 0x7fffffffffff;
    if (*(char *)(uVar8 + 10) == '\0') {
      pTVar5 = L->base + *(byte *)(*(long *)(uVar8 + 0x20) + -0x5d);
    }
    else {
      pTVar5 = L->top;
    }
    pcVar9 = lj_cont_condf;
    if ((op & 1U) == 0) {
      pcVar9 = lj_cont_condt;
    }
    pTVar5->n = (lua_Number)pcVar9;
    pTVar5[1].u64 = 0xffffffffffffffff;
    pTVar5[2] = *pcVar4;
    pTVar5[3].u64 = 0xffffffffffffffff;
    pTVar5[4] = *o1;
    pTVar5[5] = *o2;
    return pTVar5 + 4;
  }
LAB_001136e4:
  lj_err_comp(L,o1,o2);
}

Assistant:

TValue *lj_meta_comp(lua_State *L, cTValue *o1, cTValue *o2, int op)
{
  if (LJ_HASFFI && (tviscdata(o1) || tviscdata(o2))) {
    ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
    MMS mm = (op & 2) ? MM_le : MM_lt;
    cTValue *mo = lj_meta_lookup(L, tviscdata(o1) ? o1 : o2, mm);
    if (LJ_UNLIKELY(tvisnil(mo))) goto err;
    return mmcall(L, cont, mo, o1, o2);
  } else if (LJ_52 || itype(o1) == itype(o2)) {
    /* Never called with two numbers. */
    if (tvisstr(o1) && tvisstr(o2)) {
      int32_t res = lj_str_cmp(strV(o1), strV(o2));
      return (TValue *)(intptr_t)(((op&2) ? res <= 0 : res < 0) ^ (op&1));
    } else {
    trymt:
      while (1) {
	ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
	MMS mm = (op & 2) ? MM_le : MM_lt;
	cTValue *mo = lj_meta_lookup(L, o1, mm);
#if LJ_52
	if (tvisnil(mo) && tvisnil((mo = lj_meta_lookup(L, o2, mm))))
#else
	cTValue *mo2 = lj_meta_lookup(L, o2, mm);
	if (tvisnil(mo) || !lj_obj_equal(mo, mo2))
#endif
	{
	  if (op & 2) {  /* MM_le not found: retry with MM_lt. */
	    cTValue *ot = o1; o1 = o2; o2 = ot;  /* Swap operands. */
	    op ^= 3;  /* Use LT and flip condition. */
	    continue;
	  }
	  goto err;
	}
	return mmcall(L, cont, mo, o1, o2);
      }
    }
  } else if (tvisbool(o1) && tvisbool(o2)) {
    goto trymt;
  } else {
  err:
    lj_err_comp(L, o1, o2);
    return NULL;
  }
}